

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

void highsSparseTranspose
               (HighsInt numRow,HighsInt numCol,vector<int,_std::allocator<int>_> *Astart,
               vector<int,_std::allocator<int>_> *Aindex,
               vector<double,_std::allocator<double>_> *Avalue,
               vector<int,_std::allocator<int>_> *ARstart,vector<int,_std::allocator<int>_> *ARindex
               ,vector<double,_std::allocator<double>_> *ARvalue)

{
  int iVar1;
  pointer piVar2;
  int *piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  allocator_type local_61;
  uint local_60;
  value_type_conflict2 local_5c;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  local_5c = 0;
  local_60 = numCol;
  local_40 = Astart;
  local_38 = Avalue;
  std::vector<int,_std::allocator<int>_>::vector(&local_58,(long)numRow,&local_5c,&local_61);
  local_5c = 0;
  std::vector<int,_std::allocator<int>_>::resize(ARstart,(long)(numRow + 1),&local_5c);
  uVar9 = (uint)((ulong)((long)(Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::resize(ARindex,(long)(int)uVar9);
  std::vector<double,_std::allocator<double>_>::resize(ARvalue,(long)(int)uVar9);
  if (0 < (int)uVar9) {
    piVar2 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar8 = 0;
    do {
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar2[uVar8]] =
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar2[uVar8]] + 1;
      uVar8 = uVar8 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar8);
  }
  if (0 < numRow) {
    piVar3 = (ARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = *piVar3;
    uVar8 = 0;
    do {
      iVar11 = iVar11 + local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
      piVar3[uVar8 + 1] = iVar11;
      uVar8 = uVar8 + 1;
    } while ((uint)numRow != uVar8);
  }
  if (0 < numRow) {
    piVar2 = (ARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] = piVar2[uVar8];
      uVar8 = uVar8 + 1;
    } while ((uint)numRow != uVar8);
  }
  if (0 < (int)local_60) {
    piVar2 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar5 = (ARindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (ARvalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      lVar10 = (long)piVar2[uVar8];
      uVar12 = uVar8 + 1;
      if (piVar2[uVar8] < piVar2[uVar8 + 1]) {
        do {
          iVar11 = piVar4[lVar10];
          iVar1 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar11];
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar11] = iVar1 + 1;
          piVar5[iVar1] = (int)uVar8;
          pdVar7[iVar1] = pdVar6[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 < piVar2[uVar12]);
      }
      uVar8 = uVar12;
    } while (uVar12 != local_60);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void highsSparseTranspose(HighsInt numRow, HighsInt numCol,
                          const std::vector<HighsInt>& Astart,
                          const std::vector<HighsInt>& Aindex,
                          const std::vector<double>& Avalue,
                          std::vector<HighsInt>& ARstart,
                          std::vector<HighsInt>& ARindex,
                          std::vector<double>& ARvalue) {
  // Make a AR copy
  std::vector<HighsInt> iwork(numRow, 0);
  ARstart.resize(numRow + 1, 0);
  HighsInt AcountX = Aindex.size();
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (HighsInt k = 0; k < AcountX; k++) {
    assert(Aindex[k] < numRow);
    iwork[Aindex[k]]++;
  }
  for (HighsInt i = 1; i <= numRow; i++)
    ARstart[i] = ARstart[i - 1] + iwork[i - 1];
  for (HighsInt i = 0; i < numRow; i++) iwork[i] = ARstart[i];
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      HighsInt iRow = Aindex[k];
      HighsInt iPut = iwork[iRow]++;
      ARindex[iPut] = iCol;
      ARvalue[iPut] = Avalue[k];
    }
  }
}